

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.cpp
# Opt level: O2

Builder * embree::sse2::BVH4Triangle4vMeshBuilderMortonGeneral
                    (void *bvh,TriangleMesh *mesh,uint geomID,size_t mode)

{
  BVHNMeshBuilderMorton<4,_embree::TriangleMesh,_embree::TriangleMv<4>_> *this;
  
  this = (BVHNMeshBuilderMorton<4,_embree::TriangleMesh,_embree::TriangleMv<4>_> *)
         ::operator_new(0x78);
  BVHNMeshBuilderMorton<4,_embree::TriangleMesh,_embree::TriangleMv<4>_>::BVHNMeshBuilderMorton
            (this,(BVH *)bvh,mesh,geomID,4,4,0x400);
  return &this->super_Builder;
}

Assistant:

Builder* BVH4Triangle4vMeshBuilderMortonGeneral (void* bvh, TriangleMesh* mesh, unsigned int geomID, size_t mode) { return new class BVHNMeshBuilderMorton<4,TriangleMesh,Triangle4v>((BVH4*)bvh,mesh,geomID,4,4); }